

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O0

complex<double> __thiscall
VarianceSwapsHestonAnalyticalPricer::functionC
          (VarianceSwapsHestonAnalyticalPricer *this,double tau,double omega)

{
  double dVar1;
  double dVar2;
  double dVar3;
  complex<double> cVar4;
  double local_1b8;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  double local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  double local_128;
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  double local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  complex<double> g;
  complex<double> b;
  complex<double> a;
  double sigma;
  double theta;
  double kappa;
  double mu;
  double r;
  double omega_local;
  double tau_local;
  VarianceSwapsHestonAnalyticalPricer *this_local;
  
  r = omega;
  omega_local = tau;
  tau_local = (double)this;
  mu = HestonModel::getRiskFreeRate(this->hestonModel_);
  kappa = HestonModel::getDrift(this->hestonModel_);
  dVar1 = HestonModel::getMeanReversionSpeed(this->hestonModel_);
  dVar2 = HestonModel::getMeanReversionLevel(this->hestonModel_);
  dVar3 = HestonModel::getVolOfVol(this->hestonModel_);
  aTerm(this,r);
  bTerm(this,r);
  b._M_value._0_8_ = omega;
  gTerm(this,r);
  g._M_value._0_8_ = omega;
  std::operator*(&j,&r);
  local_c8._8_8_ = omega;
  std::operator*((complex<double> *)local_c8,&kappa);
  local_b8._8_8_ = omega;
  std::operator-((complex<double> *)local_b8,&mu);
  local_a8._8_8_ = omega;
  std::operator*(&omega_local,(complex<double> *)local_a8);
  dVar3 = dVar3 * dVar3;
  local_e0 = (dVar1 * dVar2) / dVar3;
  local_98._8_8_ = omega;
  std::operator-((complex<double> *)(b._M_value + 8),(complex<double> *)(g._M_value + 8));
  local_110._8_8_ = dVar3;
  std::operator*((complex<double> *)local_110,&omega_local);
  local_128 = 2.0;
  local_160 = 1.0;
  local_100._8_8_ = dVar3;
  std::operator-((complex<double> *)(g._M_value + 8));
  local_1a0._8_8_ = dVar3;
  std::operator*((complex<double> *)local_1a0,&omega_local);
  local_190._8_8_ = dVar3;
  std::exp<double>((complex<double> *)local_190);
  local_180._8_8_ = dVar3;
  std::operator*((complex<double> *)local_88,(complex<double> *)local_180);
  local_170._8_8_ = dVar3;
  std::operator-(&local_160,(complex<double> *)local_170);
  local_1b8 = 1.0;
  local_158._8_8_ = dVar3;
  std::operator-(&local_1b8,(complex<double> *)local_88);
  local_1b0._8_8_ = dVar3;
  std::operator/((complex<double> *)local_158,(complex<double> *)local_1b0);
  local_148._8_8_ = dVar3;
  std::log<double>((complex<double> *)local_148);
  local_138._8_8_ = dVar3;
  std::operator*(&local_128,(complex<double> *)local_138);
  local_120._8_8_ = dVar3;
  std::operator-((complex<double> *)local_100,(complex<double> *)local_120);
  local_f0._8_8_ = dVar3;
  std::operator*(&local_e0,(complex<double> *)local_f0);
  local_d8._8_8_ = dVar3;
  cVar4 = std::operator+((complex<double> *)local_98,(complex<double> *)local_d8);
  return (complex<double>)cVar4._M_value;
}

Assistant:

std::complex<double> VarianceSwapsHestonAnalyticalPricer::
functionC(double tau, double omega) const {
    double r = hestonModel_->getRiskFreeRate(),
           mu = hestonModel_->getDrift(),
           kappa = hestonModel_->getMeanReversionSpeed(),
           theta = hestonModel_->getMeanReversionLevel(),
           sigma = hestonModel_->getVolOfVol();
    std::complex<double> a = aTerm(omega),
                        b = bTerm(omega),
                        g = gTerm(omega);
    return tau*(j * omega*mu - r)+ kappa * theta / (sigma*sigma) * ((a-b)*tau-2.*std::log((1.-g*std::exp(-b*tau))/(1.-g))) ; // definition in class
    // return tau * r * (j * omega - 1.)+ kappa * theta / (sigma*sigma) * ((a+b)*tau-2.*std::log((1.-g*std::exp(b*tau))/(1.-g))) ; // definition in PDF
}